

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

CPscl cp_decl_spec(CPState *cp,CPDecl *decl,CPscl scl)

{
  GCstr *pGVar1;
  CTState *pCVar2;
  CType *pCVar3;
  CPState *pCVar4;
  int iVar5;
  CTypeID CVar6;
  uint uVar7;
  CPDeclIdx CVar8;
  uint uVar9;
  CTypeID CVar10;
  uint uVar11;
  uint uVar12;
  ErrMsg em;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  CTInfo CVar16;
  ulong uVar17;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar18;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar19;
  CPValue k;
  uint local_74;
  uint local_70;
  anon_union_4_2_43a9a9ed_for_CPValue_0 local_6c;
  CTypeID CStack_68;
  CTInfo local_64;
  CPState *local_60;
  CPscl local_54;
  CPDecl *local_50;
  ulong local_48;
  ulong local_40;
  CType *local_38;
  
  decl->cp = cp;
  decl->mode = cp->mode;
  uVar17 = 0;
  decl->attr = 0;
  decl->fattr = 0;
  decl->top = 0;
  decl->pos = 0;
  decl->stack[0].next = 0;
  decl->name = (GCstr *)0x0;
  decl->redir = (GCstr *)0x0;
  local_74 = 0;
  local_60 = cp;
  local_54 = scl;
  local_50 = decl;
  uVar11 = 0;
  while( true ) {
    cp_decl_attributes(cp,decl);
    uVar12 = cp->tok;
    uVar15 = (ulong)uVar12;
    uVar9 = uVar12 - 0x10d;
    uVar14 = uVar15;
    local_70 = local_74;
    if (uVar9 < 0x14) break;
    do {
      uVar12 = (uint)uVar15;
      if (uVar11 != 0 || local_70 != 0) goto LAB_001391a1;
      CVar10 = 0x10;
      uVar11 = 0;
      local_70 = local_74;
      if ((uVar17 & 0x7a0) != 0) goto LAB_001391af;
      if ((int)uVar12 < 0x127) {
        if (uVar12 != 0x24) {
          if (uVar12 == 0x100) {
            local_70 = cp->ct->info;
            if ((local_70 & 0xf0000000) == 0x70000000) {
              local_70 = local_70 & 0xffff;
              goto LAB_00138ef4;
            }
            uVar15 = 0x100;
          }
LAB_00139187:
          local_70 = 0;
          uVar14 = uVar15;
          goto LAB_001391af;
        }
        local_70 = (cp->val).id;
LAB_00138ef4:
        cp_next(cp);
      }
      else if (uVar12 == 0x129) {
        local_70 = cp_struct_name(cp,decl,0x50000001);
        if (cp->tok == 0x7b) {
          local_48 = uVar14;
          local_40 = uVar17;
          cp_next(cp);
          _local_6c = 0x900000000;
          iVar5 = cp->tok;
          local_64 = 0x5002000a;
          uVar11 = 9;
          aVar19.i32 = 0;
          CVar10 = local_70;
          do {
            if (iVar5 != 0x100) {
              cp_err_token(cp,0x100);
            }
            pGVar1 = cp->str;
            if ((cp->val).id != 0) {
              cp_errmsg(cp,0,LJ_ERR_FFI_REDEF,pGVar1 + 1);
            }
            cp_next(cp);
            aVar18 = aVar19;
            if (cp->tok == 0x3d) {
              cp_next(cp);
              cp_expr_kint(cp,(CPValue *)&local_6c);
              aVar18.i32 = local_6c.i32;
              if (CStack_68 == 10) {
                if (local_6c.i32 < 0) {
                  uVar11 = 10;
                  goto LAB_00138fe5;
                }
              }
              else if (local_6c.i32 < 0) {
                local_64 = 0x50020009;
              }
              _local_6c = CONCAT44(9,local_6c.i32);
              uVar11 = 9;
            }
LAB_00138fe5:
            pCVar4 = local_60;
            CVar6 = lj_ctype_new(local_60->cts,&local_38);
            cp = local_60;
            pCVar2 = pCVar4->cts;
            pCVar2->tab[CVar10].sib = (CTypeID1)CVar6;
            pGVar1->marked = pGVar1->marked | 0x20;
            uVar9 = (uint)pGVar1;
            (local_38->name).gcptr32 = uVar9;
            local_38->info = (uVar11 | 0x2000000) + 0xb0000000;
            aVar19.i32 = aVar18.i32 + 1;
            _local_6c = CONCAT44(CStack_68,aVar19.i32);
            local_38->size = (CTSize)aVar18;
            uVar12 = uVar9 + 0xfb3ee249;
            uVar9 = (uVar9 ^ uVar12) - (uVar12 * 0x4000 | uVar12 >> 0x12);
            uVar12 = (uVar12 >> 0xd ^ uVar9) - (uVar9 >> 0x13) & 0x7f;
            local_38->next = pCVar2->hash[uVar12];
            pCVar2->hash[uVar12] = (CTypeID1)CVar6;
            if (local_60->tok != 0x2c) break;
            cp_next(local_60);
            iVar5 = cp->tok;
            CVar10 = CVar6;
          } while (iVar5 != 0x7d);
          cp_check(cp,0x7d);
          pCVar3 = cp->cts->tab;
          pCVar3[local_70].info = local_64;
          pCVar3[local_70].size = 4;
          uVar14 = local_48;
          uVar17 = local_40;
          decl = local_50;
        }
      }
      else {
        if (uVar12 == 0x128) {
          CVar16 = 0x10800000;
        }
        else {
          if (uVar12 != 0x127) goto LAB_00139187;
          CVar16 = 0x10000000;
        }
        local_70 = cp_decl_struct(cp,decl,CVar16);
      }
      cp_decl_attributes(cp,decl);
      uVar12 = cp->tok;
      uVar15 = (ulong)uVar12;
      uVar9 = uVar12 - 0x10d;
      uVar11 = 0;
    } while (0x13 < uVar9);
    local_74 = local_70;
    uVar13 = cp->ct->size;
LAB_0013912e:
    cp = local_60;
    uVar7 = 1 << ((byte)uVar9 & 0x1f);
    uVar17 = (ulong)((uint)uVar17 | (uVar7 & (uint)uVar17) * 2 & 0x40 | 1 << (uVar9 & 0x1f));
    uVar11 = uVar13;
    if (uVar12 < 0x11c) {
      local_70 = local_74;
      if (local_74 != 0) goto LAB_001391a1;
    }
    else if ((local_54 & uVar7) == 0) {
      em = LJ_ERR_FFI_BADSCL;
LAB_0013932e:
      cp_errmsg(cp,uVar12,em);
    }
    cp_next(local_60);
  }
  uVar7 = cp->ct->size;
  uVar13 = uVar11;
  if ((uVar7 == 0) || (cp = local_60, uVar13 = uVar7, uVar11 == 0)) goto LAB_0013912e;
LAB_001391a1:
  CVar10 = (uVar11 != 4) + 0xf;
  uVar14 = (ulong)uVar12;
LAB_001391af:
  uVar12 = (uint)uVar17;
  if ((uVar12 >> 8 & 1) != 0) {
    local_70 = CVar10;
  }
  if (local_70 != 0) {
    cp_push_type(decl,local_70);
    CVar8 = decl->pos;
    uVar11 = decl->attr;
    goto LAB_001392cd;
  }
  if ((uVar17 & 1) != 0) {
    CVar16 = decl->attr & 0x3000000 | 0x40000000;
    uVar9 = 0xffffffff;
    goto LAB_001392b7;
  }
  uVar7 = (uVar12 & 0x400) << 0xd;
  if ((uVar17 & 2) == 0) {
    if ((uVar17 & 0x10) == 0) {
      uVar9 = uVar11;
      if ((((uVar17 & 4) == 0) && (uVar9 = 2, -1 < (char)uVar17)) &&
         (uVar9 = 8, (uVar17 & 0x40) == 0)) {
        if ((uVar17 & 0x20) == 0) {
          uVar9 = uVar11;
          if ((uVar11 == 0) && (uVar9 = 4, (uVar17 & 0x600) == 0)) {
            uVar12 = (uint)uVar14;
            em = LJ_ERR_FFI_DECLSPEC;
            goto LAB_0013932e;
          }
        }
        else {
          uVar7 = uVar7 | 0x400000;
        }
      }
    }
    else {
      uVar9 = 0x10;
      if ((uVar17 & 0x20) == 0) {
        uVar9 = uVar11;
      }
      uVar7 = 0x4000000;
    }
  }
  else {
    if ((uVar17 & 0xfff079f4) != 0) {
      uVar12 = 0;
      em = LJ_ERR_FFI_INVTYPE;
      goto LAB_0013932e;
    }
    uVar7 = uVar7 | 0x8000000;
    if ((uVar12 >> 9 & 1) == 0) {
      uVar7 = 0x8800000;
    }
    uVar9 = uVar11 + (uVar11 == 0);
  }
  iVar5 = 0x1f;
  if (uVar9 != 0) {
    for (; uVar9 >> iVar5 == 0; iVar5 = iVar5 + -1) {
    }
  }
  CVar16 = (decl->attr & 0x3000000) + uVar7 + iVar5 * 0x10000;
LAB_001392b7:
  CVar8 = cp_add(decl,CVar16,uVar9);
  decl->pos = CVar8;
  uVar11 = decl->attr & 0xfcffffff;
  decl->attr = uVar11;
LAB_001392cd:
  decl->specpos = CVar8;
  decl->specattr = uVar11;
  decl->specfattr = decl->fattr;
  return uVar12 & 0xf8000;
}

Assistant:

static CPscl cp_decl_spec(CPState *cp, CPDecl *decl, CPscl scl)
{
  uint32_t cds = 0, sz = 0;
  CTypeID tdef = 0;

  decl->cp = cp;
  decl->mode = cp->mode;
  decl->name = NULL;
  decl->redir = NULL;
  decl->attr = 0;
  decl->fattr = 0;
  decl->pos = decl->top = 0;
  decl->stack[0].next = 0;

  for (;;) {  /* Parse basic types. */
    cp_decl_attributes(cp, decl);
    if (cp->tok >= CTOK_FIRSTDECL && cp->tok <= CTOK_LASTDECLFLAG) {
      uint32_t cbit;
      if (cp->ct->size) {
	if (sz) goto end_decl;
	sz = cp->ct->size;
      }
      cbit = (1u << (cp->tok - CTOK_FIRSTDECL));
      cds = cds | cbit | ((cbit & cds & CDF_LONG) << 1);
      if (cp->tok >= CTOK_FIRSTSCL) {
	if (!(scl & cbit)) cp_errmsg(cp, cp->tok, LJ_ERR_FFI_BADSCL);
      } else if (tdef) {
	goto end_decl;
      }
      cp_next(cp);
      continue;
    }
    if (sz || tdef ||
	(cds & (CDF_SHORT|CDF_LONG|CDF_SIGNED|CDF_UNSIGNED|CDF_COMPLEX)))
      break;
    switch (cp->tok) {
    case CTOK_STRUCT:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, 0));
      continue;
    case CTOK_UNION:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, CTF_UNION));
      continue;
    case CTOK_ENUM:
      tdef = cp_decl_enum(cp, decl);
      continue;
    case CTOK_IDENT:
      if (ctype_istypedef(cp->ct->info)) {
	tdef = ctype_cid(cp->ct->info);  /* Get typedef. */
	cp_next(cp);
	continue;
      }
      break;
    case '$':
      tdef = cp->val.id;
      cp_next(cp);
      continue;
    default:
      break;
    }
    break;
  }
end_decl:

  if ((cds & CDF_COMPLEX))  /* Use predefined complex types. */
    tdef = sz == 4 ? CTID_COMPLEX_FLOAT : CTID_COMPLEX_DOUBLE;

  if (tdef) {
    cp_push_type(decl, tdef);
  } else if ((cds & CDF_VOID)) {
    cp_push(decl, CTINFO(CT_VOID, (decl->attr & CTF_QUAL)), CTSIZE_INVALID);
    decl->attr &= ~CTF_QUAL;
  } else {
    /* Determine type info and size. */
    CTInfo info = CTINFO(CT_NUM, (cds & CDF_UNSIGNED) ? CTF_UNSIGNED : 0);
    if ((cds & CDF_BOOL)) {
      if ((cds & ~(CDF_SCL|CDF_BOOL|CDF_INT|CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, 0, LJ_ERR_FFI_INVTYPE);
      info |= CTF_BOOL;
      if (!(cds & CDF_SIGNED)) info |= CTF_UNSIGNED;
      if (!sz) {
	sz = 1;
      }
    } else if ((cds & CDF_FP)) {
      info = CTINFO(CT_NUM, CTF_FP);
      if ((cds & CDF_LONG)) sz = sizeof(long double);
    } else if ((cds & CDF_CHAR)) {
      if ((cds & (CDF_CHAR|CDF_SIGNED|CDF_UNSIGNED)) == CDF_CHAR)
	info |= CTF_UCHAR;  /* Handle platforms where char is unsigned. */
    } else if ((cds & CDF_SHORT)) {
      sz = sizeof(short);
    } else if ((cds & CDF_LONGLONG)) {
      sz = 8;
    } else if ((cds & CDF_LONG)) {
      info |= CTF_LONG;
      sz = sizeof(long);
    } else if (!sz) {
      if (!(cds & (CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, cp->tok, LJ_ERR_FFI_DECLSPEC);
      sz = sizeof(int);
    }
    lua_assert(sz != 0);
    info += CTALIGN(lj_fls(sz));  /* Use natural alignment. */
    info += (decl->attr & CTF_QUAL);  /* Merge qualifiers. */
    cp_push(decl, info, sz);
    decl->attr &= ~CTF_QUAL;
  }
  decl->specpos = decl->pos;
  decl->specattr = decl->attr;
  decl->specfattr = decl->fattr;
  return (cds & CDF_SCL);  /* Return storage class. */
}